

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall
pybind11::cpp_function::initialize_generic
          (cpp_function *this,unique_function_record *unique_rec,char *text,type_info **types,
          size_t args)

{
  type_info *__rhs;
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
  *this_00;
  PyObject **ppPVar5;
  undefined8 uVar6;
  char *pcVar7;
  reference pvVar8;
  type_info *ptVar9;
  pointer pfVar10;
  _func_void_void_ptr *destructor;
  PyObject *pPVar11;
  size_t sVar12;
  ulong uVar13;
  PyObject *pPVar14;
  PyTypeObject *type;
  char *local_810;
  PyTypeObject *local_770;
  byte local_6e1;
  char *local_6b8;
  PyCFunctionObject *func;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680;
  handle local_660;
  function_record *it;
  string local_650 [3];
  bool first_user_def;
  int index;
  string signatures;
  capsule local_628;
  capsule rec_capsule_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  str_attr_accessor local_5f8;
  str local_5d8;
  string local_5d0;
  allocator<char> local_5a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  str_attr_accessor local_4c8;
  object local_4a8;
  PyObject *local_4a0;
  str_attr_accessor local_498;
  object local_478;
  PyObject *local_470;
  handle local_468;
  object scope_module;
  handle local_458;
  capsule rec_capsule_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  handle local_3e8;
  capsule local_3e0;
  capsule rec_capsule;
  function_record *chain_start;
  function_record *chain;
  allocator<char> local_3b9;
  undefined1 local_3b8 [8];
  string tname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  str_attr_accessor local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  str_attr_accessor local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  str_attr_accessor local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  handle local_218;
  handle th;
  type_info *tinfo;
  type_info *t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  char local_1b1;
  char *pcStack_1b0;
  char c;
  char *pc;
  size_t arg_index;
  size_t type_index;
  string signature;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  allocator<char> local_f1;
  undefined1 local_f0 [8];
  string func_name;
  string class_name;
  object local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  reference local_80;
  argument_record *a;
  iterator __end2;
  iterator __begin2;
  vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
  *__range2;
  undefined1 local_50 [8];
  strdup_guard guarded_strdup;
  pointer rec;
  size_t args_local;
  type_info **types_local;
  char *text_local;
  unique_function_record *unique_rec_local;
  cpp_function *this_local;
  
  guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &std::
        unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
        ::get(unique_rec)->name;
  strdup_guard::strdup_guard((strdup_guard *)local_50);
  if (*guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage == (char *)0x0) {
    local_6b8 = "";
  }
  else {
    local_6b8 = *guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
  }
  pcVar4 = strdup_guard::operator()((strdup_guard *)local_50,local_6b8);
  *guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
   super__Vector_impl_data._M_end_of_storage = pcVar4;
  if (guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage[1] != (char *)0x0) {
    pcVar4 = strdup_guard::operator()
                       ((strdup_guard *)local_50,
                        guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage[1]);
    guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage[1] = pcVar4;
  }
  this_00 = (vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
             *)(guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 3);
  __end2 = std::
           vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
           ::begin(this_00);
  a = (argument_record *)
      std::
      vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
      ::end(this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<pybind11::detail::argument_record_*,_std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>_>
                                     *)&a), bVar2) {
    local_80 = __gnu_cxx::
               __normal_iterator<pybind11::detail::argument_record_*,_std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>_>
               ::operator*(&__end2);
    if (local_80->name != (char *)0x0) {
      pcVar4 = strdup_guard::operator()((strdup_guard *)local_50,local_80->name);
      local_80->name = pcVar4;
    }
    if (local_80->descr == (char *)0x0) {
      bVar2 = handle::operator_cast_to_bool(&local_80->value);
      if (bVar2) {
        repr((pybind11 *)&local_a8,(local_80->value).m_ptr);
        object::cast<std::__cxx11::string>(&local_a0,&local_a8);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        pcVar4 = strdup_guard::operator()((strdup_guard *)local_50,pcVar4);
        local_80->descr = pcVar4;
        std::__cxx11::string::~string((string *)&local_a0);
        str::~str((str *)&local_a8);
      }
    }
    else {
      pcVar4 = strdup_guard::operator()((strdup_guard *)local_50,local_80->descr);
      local_80->descr = pcVar4;
    }
    __gnu_cxx::
    __normal_iterator<pybind11::detail::argument_record_*,_std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>_>
    ::operator++(&__end2);
  }
  iVar3 = strcmp(*guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,"__init__");
  local_6e1 = 1;
  if (iVar3 != 0) {
    iVar3 = strcmp(*guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,"__setstate__");
    local_6e1 = iVar3 != 0 ^ 0xff;
  }
  *(ushort *)
   ((long)guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage + 0x59) =
       *(ushort *)
        ((long)guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 0x59) & 0xfffe | (ushort)(local_6e1 & 1);
  if (((*(ushort *)
         ((long)guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 0x59) & 1) != 0) &&
     ((*(ushort *)
        ((long)guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 0x59) >> 1 & 1) == 0)) {
    ppPVar5 = handle::ptr((handle *)
                          (guarded_strdup.strings.
                           super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 0xe));
    detail::get_fully_qualified_tp_name_abi_cxx11_
              ((string *)((long)&func_name.field_2 + 8),(detail *)*ppPVar5,type);
    pcVar4 = *guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_f0,pcVar4,&local_f1);
    std::allocator<char>::~allocator(&local_f1);
    uVar1 = _PyExc_FutureWarning;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&signature.field_2 + 8),"pybind11-bound class \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&func_name.field_2 + 8));
    std::operator+(&local_158,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&signature.field_2 + 8),"\' is using an old-style placement-new \'");
    std::operator+(&local_138,&local_158,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
    std::operator+(&local_118,&local_138,
                   "\' which has been deprecated. See the upgrade guide in pybind11\'s docs. This message is only visible when compiled in debug mode."
                  );
    uVar6 = std::__cxx11::string::c_str();
    PyErr_WarnEx(uVar1,uVar6,0);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)(signature.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_f0);
    std::__cxx11::string::~string((string *)(func_name.field_2._M_local_buf + 8));
  }
  std::__cxx11::string::string((string *)&type_index);
  arg_index = 0;
  pc = (char *)0x0;
  for (pcStack_1b0 = text; pcVar4 = pc, *pcStack_1b0 != '\0'; pcStack_1b0 = pcStack_1b0 + 1) {
    local_1b1 = *pcStack_1b0;
    if (local_1b1 == '{') {
      if (pcStack_1b0[1] != '*') {
        if ((*(short *)((long)guarded_strdup.strings.
                              super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 0x5e) != 0) &&
           (pc + *(ushort *)
                  ((long)guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 0x5e) == (char *)args))
        {
          std::__cxx11::string::operator+=((string *)&type_index,"*, ");
        }
        pcVar4 = pc;
        pcVar7 = (char *)std::
                         vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                         ::size((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                 *)(guarded_strdup.strings.
                                    super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage + 3));
        if ((pcVar4 < pcVar7) &&
           (pvVar8 = std::
                     vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                     ::operator[]((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                   *)(guarded_strdup.strings.
                                      super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage + 3),(size_type)pc),
           pvVar8->name != (char *)0x0)) {
          pvVar8 = std::
                   vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                   ::operator[]((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                 *)(guarded_strdup.strings.
                                    super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage + 3),(size_type)pc);
          std::__cxx11::string::operator+=((string *)&type_index,pvVar8->name);
        }
        else if ((pc == (char *)0x0) &&
                ((*(ushort *)
                   ((long)guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x59) >> 4 & 1) != 0)
                ) {
          std::__cxx11::string::operator+=((string *)&type_index,"self");
        }
        else {
          std::__cxx11::to_string
                    ((string *)&t,
                     (long)pc -
                     (ulong)((*(ushort *)
                               ((long)guarded_strdup.strings.
                                      super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage + 0x59) >> 4 & 1) !=
                            0));
          std::operator+(&local_1d8,"arg",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t);
          std::__cxx11::string::operator+=((string *)&type_index,(string *)&local_1d8);
          std::__cxx11::string::~string((string *)&local_1d8);
          std::__cxx11::string::~string((string *)&t);
        }
        std::__cxx11::string::operator+=((string *)&type_index,": ");
      }
    }
    else if (local_1b1 == '}') {
      pcVar7 = (char *)std::
                       vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                       ::size((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                               *)(guarded_strdup.strings.
                                  super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage + 3));
      if ((pcVar4 < pcVar7) &&
         (pvVar8 = std::
                   vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                   ::operator[]((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                 *)(guarded_strdup.strings.
                                    super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage + 3),(size_type)pc),
         pvVar8->descr != (char *)0x0)) {
        std::__cxx11::string::operator+=((string *)&type_index," = ");
        pvVar8 = std::
                 vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                 ::operator[]((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                               *)(guarded_strdup.strings.
                                  super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage + 3),(size_type)pc);
        std::__cxx11::string::operator+=((string *)&type_index,pvVar8->descr);
      }
      if ((*(short *)(guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 0xc) != 0) &&
         (pc + 1 == (char *)(ulong)*(ushort *)
                                    (guarded_strdup.strings.
                                     super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage + 0xc))) {
        std::__cxx11::string::operator+=((string *)&type_index,", /");
      }
      pc = pc + 1;
    }
    else if (local_1b1 == '%') {
      __rhs = types[arg_index];
      if (__rhs == (type_info *)0x0) {
        arg_index = arg_index + 1;
        pybind11_fail("Internal error while parsing type signature (1)");
      }
      arg_index = arg_index + 1;
      std::type_index::type_index((type_index *)&th,__rhs);
      ptVar9 = detail::get_type_info((type_index *)&th,false);
      if (ptVar9 == (type_info *)0x0) {
        if (((*(ushort *)
               ((long)guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 0x59) >> 1 & 1) == 0) ||
           (pc != (char *)0x0)) {
          pcVar4 = std::type_info::name(__rhs);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)local_3b8,pcVar4,&local_3b9);
          std::allocator<char>::~allocator(&local_3b9);
          detail::clean_type_id((string *)local_3b8);
          std::__cxx11::string::operator+=((string *)&type_index,(string *)local_3b8);
          std::__cxx11::string::~string((string *)local_3b8);
        }
        else {
          detail::object_api<pybind11::handle>::attr
                    (&local_358,
                     (object_api<pybind11::handle> *)
                     (guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 0xe),"__module__");
          detail::accessor<pybind11::detail::accessor_policies::str_attr>::
          cast<std::__cxx11::string>(&local_338,&local_358);
          std::operator+(&local_318,&local_338,".");
          detail::object_api<pybind11::handle>::attr
                    ((str_attr_accessor *)((long)&tname.field_2 + 8),
                     (object_api<pybind11::handle> *)
                     (guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 0xe),"__qualname__");
          detail::accessor<pybind11::detail::accessor_policies::str_attr>::
          cast<std::__cxx11::string>
                    (&local_378,
                     (accessor<pybind11::detail::accessor_policies::str_attr> *)
                     ((long)&tname.field_2 + 8));
          std::operator+(&local_2f8,&local_318,&local_378);
          std::__cxx11::string::operator+=((string *)&type_index,(string *)&local_2f8);
          std::__cxx11::string::~string((string *)&local_2f8);
          std::__cxx11::string::~string((string *)&local_378);
          detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor
                    ((accessor<pybind11::detail::accessor_policies::str_attr> *)
                     ((long)&tname.field_2 + 8));
          std::__cxx11::string::~string((string *)&local_318);
          std::__cxx11::string::~string((string *)&local_338);
          detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_358);
        }
      }
      else {
        handle::handle(&local_218,(PyObject *)ptVar9->type);
        detail::object_api<pybind11::handle>::attr
                  (&local_298,(object_api<pybind11::handle> *)&local_218,"__module__");
        detail::accessor<pybind11::detail::accessor_policies::str_attr>::cast<std::__cxx11::string>
                  (&local_278,&local_298);
        std::operator+(&local_258,&local_278,".");
        detail::object_api<pybind11::handle>::attr
                  (&local_2d8,(object_api<pybind11::handle> *)&local_218,"__qualname__");
        detail::accessor<pybind11::detail::accessor_policies::str_attr>::cast<std::__cxx11::string>
                  (&local_2b8,&local_2d8);
        std::operator+(&local_238,&local_258,&local_2b8);
        std::__cxx11::string::operator+=((string *)&type_index,(string *)&local_238);
        std::__cxx11::string::~string((string *)&local_238);
        std::__cxx11::string::~string((string *)&local_2b8);
        detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_2d8);
        std::__cxx11::string::~string((string *)&local_258);
        std::__cxx11::string::~string((string *)&local_278);
        detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_298);
      }
    }
    else {
      std::__cxx11::string::operator+=((string *)&type_index,local_1b1);
    }
  }
  if ((pc == (char *)args) && (types[arg_index] == (type_info *)0x0)) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    pcVar4 = strdup_guard::operator()((strdup_guard *)local_50,pcVar4);
    guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage[2] = pcVar4;
    std::
    vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>::
    shrink_to_fit((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                   *)(guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
    *(short *)((long)guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 0x5c) = (short)args;
    bVar2 = handle::operator_cast_to_bool
                      ((handle *)
                       (guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage + 0xf));
    if (bVar2) {
      ppPVar5 = handle::ptr((handle *)
                            (guarded_strdup.strings.
                             super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 0xf));
      iVar3 = _Py_IS_TYPE(*ppPVar5,(PyTypeObject *)&PyInstanceMethod_Type);
      if (iVar3 != 0) {
        ppPVar5 = handle::ptr((handle *)
                              (guarded_strdup.strings.
                               super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 0xf));
        handle::handle((handle *)&chain,(PyObject *)(*ppPVar5)[1].ob_refcnt);
        guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage[0xf] = (char *)chain;
      }
    }
    chain_start = (function_record *)0x0;
    rec_capsule.super_object.super_handle.m_ptr =
         (object)(object)guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
    bVar2 = handle::operator_cast_to_bool
                      ((handle *)
                       (guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage + 0xf));
    if (bVar2) {
      ppPVar5 = handle::ptr((handle *)
                            (guarded_strdup.strings.
                             super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 0xf));
      iVar3 = _PyObject_TypeCheck(*ppPVar5,(PyTypeObject *)&PyCFunction_Type);
      if (iVar3 == 0) {
        bVar2 = detail::object_api<pybind11::handle>::is_none
                          ((object_api<pybind11::handle> *)
                           (guarded_strdup.strings.
                            super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 0xf));
        if ((!bVar2) &&
           (**guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage != '_')) {
          pcVar4 = *guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_448,pcVar4,
                     (allocator<char> *)((long)&rec_capsule_1.super_object.super_handle.m_ptr + 7));
          std::operator+(&local_428,"Cannot overload existing non-function object \"",&local_448);
          std::operator+(&local_408,&local_428,"\" with a function of the same name");
          pybind11_fail(&local_408);
        }
      }
      else {
        ppPVar5 = handle::ptr((handle *)
                              (guarded_strdup.strings.
                               super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 0xf));
        if ((*(uint *)((*ppPVar5)[1].ob_refcnt + 0x10) & 0x20) == 0) {
          ppPVar5 = handle::ptr((handle *)
                                (guarded_strdup.strings.
                                 super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage + 0xf));
          local_770 = (*ppPVar5)[1].ob_type;
        }
        else {
          local_770 = (PyTypeObject *)0x0;
        }
        handle::handle(&local_3e8,(PyObject *)local_770);
        reinterpret_borrow<pybind11::capsule>((pybind11 *)&local_3e0,local_3e8);
        chain_start = capsule::operator_cast_to_function_record_(&local_3e0);
        bVar2 = detail::object_api<pybind11::handle>::is
                          ((object_api<pybind11::handle> *)&chain_start->scope,
                           (object_api<pybind11::handle> *)
                           (guarded_strdup.strings.
                            super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 0xe));
        if (!bVar2) {
          chain_start = (function_record *)0x0;
        }
        capsule::~capsule(&local_3e0);
      }
    }
    if (chain_start == (function_record *)0x0) {
      pcVar4 = (char *)operator_new(0x20);
      pcVar4[0x10] = '\0';
      pcVar4[0x11] = '\0';
      pcVar4[0x12] = '\0';
      pcVar4[0x13] = '\0';
      pcVar4[0x14] = '\0';
      pcVar4[0x15] = '\0';
      pcVar4[0x16] = '\0';
      pcVar4[0x17] = '\0';
      pcVar4[0x18] = '\0';
      pcVar4[0x19] = '\0';
      pcVar4[0x1a] = '\0';
      pcVar4[0x1b] = '\0';
      pcVar4[0x1c] = '\0';
      pcVar4[0x1d] = '\0';
      pcVar4[0x1e] = '\0';
      pcVar4[0x1f] = '\0';
      pcVar4[0] = '\0';
      pcVar4[1] = '\0';
      pcVar4[2] = '\0';
      pcVar4[3] = '\0';
      pcVar4[4] = '\0';
      pcVar4[5] = '\0';
      pcVar4[6] = '\0';
      pcVar4[7] = '\0';
      pcVar4[8] = '\0';
      pcVar4[9] = '\0';
      pcVar4[10] = '\0';
      pcVar4[0xb] = '\0';
      pcVar4[0xc] = '\0';
      pcVar4[0xd] = '\0';
      pcVar4[0xe] = '\0';
      pcVar4[0xf] = '\0';
      guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage[0xd] = pcVar4;
      pcVar4 = guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage[0xd];
      pcVar4[0x10] = '\0';
      pcVar4[0x11] = '\0';
      pcVar4[0x12] = '\0';
      pcVar4[0x13] = '\0';
      pcVar4[0x14] = '\0';
      pcVar4[0x15] = '\0';
      pcVar4[0x16] = '\0';
      pcVar4[0x17] = '\0';
      pcVar4[0x18] = '\0';
      pcVar4[0x19] = '\0';
      pcVar4[0x1a] = '\0';
      pcVar4[0x1b] = '\0';
      pcVar4[0x1c] = '\0';
      pcVar4[0x1d] = '\0';
      pcVar4[0x1e] = '\0';
      pcVar4[0x1f] = '\0';
      pcVar4[0] = '\0';
      pcVar4[1] = '\0';
      pcVar4[2] = '\0';
      pcVar4[3] = '\0';
      pcVar4[4] = '\0';
      pcVar4[5] = '\0';
      pcVar4[6] = '\0';
      pcVar4[7] = '\0';
      pcVar4[8] = '\0';
      pcVar4[9] = '\0';
      pcVar4[10] = '\0';
      pcVar4[0xb] = '\0';
      pcVar4[0xc] = '\0';
      pcVar4[0xd] = '\0';
      pcVar4[0xe] = '\0';
      pcVar4[0xf] = '\0';
      *(char **)guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[0xd] =
           *guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
      *(code **)(guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage[0xd] + 8) = dispatcher;
      pcVar4 = guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage[0xd];
      pcVar4[0x10] = '\x03';
      pcVar4[0x11] = '\0';
      pcVar4[0x12] = '\0';
      pcVar4[0x13] = '\0';
      pfVar10 = std::
                unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                ::release(unique_rec);
      destructor = initialize_generic(std::unique_ptr&&,char_const*,std::type_info_const*const*,unsigned_long)
                   ::{lambda(void*)#1}::operator_cast_to_function_pointer
                             ((_lambda_void___1_ *)((long)&scope_module.super_handle.m_ptr + 7));
      capsule::capsule((capsule *)&local_458,pfVar10,destructor);
      strdup_guard::release((strdup_guard *)local_50);
      object::object((object *)&local_468);
      bVar2 = handle::operator_cast_to_bool
                        ((handle *)
                         (guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 0xe));
      if (bVar2) {
        local_470 = (PyObject *)
                    guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage[0xe];
        bVar2 = hasattr((handle)local_470,"__module__");
        if (bVar2) {
          detail::object_api<pybind11::handle>::attr
                    (&local_498,
                     (object_api<pybind11::handle> *)
                     (guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 0xe),"__module__");
          detail::accessor::operator_cast_to_object((accessor *)&local_478);
          object::operator=((object *)&local_468,&local_478);
          object::~object(&local_478);
          detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_498);
        }
        else {
          local_4a0 = (PyObject *)
                      guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage[0xe];
          bVar2 = hasattr((handle)local_4a0,"__name__");
          if (bVar2) {
            detail::object_api<pybind11::handle>::attr
                      (&local_4c8,
                       (object_api<pybind11::handle> *)
                       (guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage + 0xe),"__name__");
            detail::accessor::operator_cast_to_object((accessor *)&local_4a8);
            object::operator=((object *)&local_468,&local_4a8);
            object::~object(&local_4a8);
            detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_4c8);
          }
        }
      }
      pcVar4 = guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage[0xd];
      ppPVar5 = handle::ptr(&local_458);
      pPVar11 = *ppPVar5;
      ppPVar5 = handle::ptr(&local_468);
      pPVar11 = (PyObject *)PyCMethod_New(pcVar4,pPVar11,*ppPVar5,0);
      (this->super_function).super_object.super_handle.m_ptr = pPVar11;
      if ((this->super_function).super_object.super_handle.m_ptr == (PyObject *)0x0) {
        pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
      }
      object::~object((object *)&local_468);
      capsule::~capsule((capsule *)&local_458);
    }
    else {
      ppPVar5 = handle::ptr((handle *)
                            (guarded_strdup.strings.
                             super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 0xf));
      (this->super_function).super_object.super_handle.m_ptr = *ppPVar5;
      handle::inc_ref((handle *)this);
      if (((byte)(*(ushort *)&chain_start->field_0x59 >> 4) & 1) !=
          ((byte)(*(ushort *)
                   ((long)guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x59) >> 4) & 1)) {
        pcVar4 = "static";
        if ((*(byte *)((long)guarded_strdup.strings.
                             super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 0x59) >> 4 & 1) != 0) {
          pcVar4 = "instance";
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a8,pcVar4,&local_5a9);
        std::operator+(&local_588,
                       "overloading a method with both static and instance methods is not supported; error while attempting to bind "
                       ,&local_5a8);
        std::operator+(&local_568,&local_588," method ");
        detail::object_api<pybind11::handle>::attr
                  (&local_5f8,
                   (object_api<pybind11::handle> *)
                   (guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 0xe),"__name__");
        str::str<pybind11::detail::accessor_policies::str_attr>(&local_5d8,&local_5f8);
        str::operator_cast_to_string(&local_5d0,&local_5d8);
        std::operator+(&local_548,&local_568,&local_5d0);
        std::operator+(&local_528,&local_548,".");
        pcVar4 = *guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_618,pcVar4,
                   (allocator<char> *)((long)&rec_capsule_2.super_object.super_handle.m_ptr + 7));
        std::operator+(&local_508,&local_528,&local_618);
        std::operator+(&local_4e8,&local_508,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &type_index);
        pybind11_fail(&local_4e8);
      }
      if ((*(ushort *)
            ((long)guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 0x59) >> 8 & 1) == 0) {
        rec_capsule.super_object.super_handle.m_ptr = (object)(object)chain_start;
        for (; chain_start->next != (function_record *)0x0; chain_start = chain_start->next) {
        }
        pfVar10 = std::
                  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                  ::release(unique_rec);
        chain_start->next = pfVar10;
        strdup_guard::release((strdup_guard *)local_50);
      }
      else {
        rec_capsule.super_object.super_handle.m_ptr =
             (object)(object)guarded_strdup.strings.
                             super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage[0x10] = (char *)chain_start;
        handle::handle((handle *)((long)&signatures.field_2 + 8),
                       (PyObject *)(this->super_function).super_object.super_handle.m_ptr[1].ob_type
                      );
        reinterpret_borrow<pybind11::capsule>
                  ((pybind11 *)&local_628,(handle)signatures.field_2._8_8_);
        pfVar10 = std::
                  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                  ::release(unique_rec);
        capsule::set_pointer(&local_628,pfVar10);
        strdup_guard::release((strdup_guard *)local_50);
        capsule::~capsule(&local_628);
      }
    }
    std::__cxx11::string::string(local_650);
    it._4_4_ = 0;
    if ((chain_start != (function_record *)0x0) &&
       (bVar2 = options::show_function_signatures(), bVar2)) {
      std::__cxx11::string::operator+=
                (local_650,
                 *guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::operator+=(local_650,"(*args, **kwargs)\n");
      std::__cxx11::string::operator+=(local_650,"Overloaded function.\n\n");
    }
    it._3_1_ = 1;
    for (local_660.m_ptr = (PyObject *)rec_capsule.super_object.super_handle.m_ptr;
        local_660.m_ptr != (PyObject *)0x0;
        local_660.m_ptr = (PyObject *)local_660.m_ptr[8].ob_refcnt) {
      bVar2 = options::show_function_signatures();
      if (bVar2) {
        if (0 < it._4_4_) {
          std::__cxx11::string::operator+=(local_650,"\n");
        }
        if (chain_start != (function_record *)0x0) {
          it._4_4_ = it._4_4_ + 1;
          std::__cxx11::to_string((string *)&func,it._4_4_);
          std::operator+(&local_680,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&func,
                         ". ");
          std::__cxx11::string::operator+=(local_650,(string *)&local_680);
          std::__cxx11::string::~string((string *)&local_680);
          std::__cxx11::string::~string((string *)&func);
        }
        std::__cxx11::string::operator+=
                  (local_650,
                   *guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::operator+=(local_650,(char *)local_660.m_ptr[1].ob_refcnt);
        std::__cxx11::string::operator+=(local_650,"\n");
      }
      if ((((local_660.m_ptr)->ob_type != (PyTypeObject *)0x0) &&
          (sVar12 = strlen((char *)(local_660.m_ptr)->ob_type), sVar12 != 0)) &&
         (bVar2 = options::show_user_defined_docstrings(), bVar2)) {
        bVar2 = options::show_function_signatures();
        if (!bVar2) {
          if ((it._3_1_ & 1) == 0) {
            std::__cxx11::string::operator+=(local_650,"\n");
          }
          else {
            it._3_1_ = 0;
          }
        }
        bVar2 = options::show_function_signatures();
        if (bVar2) {
          std::__cxx11::string::operator+=(local_650,"\n");
        }
        std::__cxx11::string::operator+=(local_650,(char *)(local_660.m_ptr)->ob_type);
        bVar2 = options::show_function_signatures();
        if (bVar2) {
          std::__cxx11::string::operator+=(local_650,"\n");
        }
      }
    }
    pPVar11 = (this->super_function).super_object.super_handle.m_ptr;
    free(*(void **)(pPVar11[1].ob_refcnt + 0x18));
    uVar13 = std::__cxx11::string::empty();
    if ((uVar13 & 1) == 0) {
      pcVar4 = (char *)std::__cxx11::string::c_str();
      local_810 = strdup(pcVar4);
    }
    else {
      local_810 = (char *)0x0;
    }
    *(char **)(pPVar11[1].ob_refcnt + 0x18) = local_810;
    if ((*(ushort *)
          ((long)guarded_strdup.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 0x59) >> 4 & 1) != 0) {
      pPVar14 = (PyObject *)
                PyInstanceMethod_New((this->super_function).super_object.super_handle.m_ptr);
      (this->super_function).super_object.super_handle.m_ptr = pPVar14;
      if ((this->super_function).super_object.super_handle.m_ptr == (PyObject *)0x0) {
        pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
      }
      _Py_DECREF(pPVar11);
    }
    std::__cxx11::string::~string(local_650);
    std::__cxx11::string::~string((string *)&type_index);
    strdup_guard::~strdup_guard((strdup_guard *)local_50);
    return;
  }
  pybind11_fail("Internal error while parsing type signature (2)");
}

Assistant:

void initialize_generic(unique_function_record &&unique_rec, const char *text,
                            const std::type_info *const *types, size_t args) {
        // Do NOT receive `unique_rec` by value. If this function fails to move out the unique_ptr,
        // we do not want this to destuct the pointer. `initialize` (the caller) still relies on the
        // pointee being alive after this call. Only move out if a `capsule` is going to keep it alive.
        auto rec = unique_rec.get();

        // Keep track of strdup'ed strings, and clean them up as long as the function's capsule
        // has not taken ownership yet (when `unique_rec.release()` is called).
        // Note: This cannot easily be fixed by a `unique_ptr` with custom deleter, because the strings
        // are only referenced before strdup'ing. So only *after* the following block could `destruct`
        // safely be called, but even then, `repr` could still throw in the middle of copying all strings.
        strdup_guard guarded_strdup;

        /* Create copies of all referenced C-style strings */
        rec->name = guarded_strdup(rec->name ? rec->name : "");
        if (rec->doc) rec->doc = guarded_strdup(rec->doc);
        for (auto &a: rec->args) {
            if (a.name)
                a.name = guarded_strdup(a.name);
            if (a.descr)
                a.descr = guarded_strdup(a.descr);
            else if (a.value)
                a.descr = guarded_strdup(repr(a.value).cast<std::string>().c_str());
        }

        rec->is_constructor = !strcmp(rec->name, "__init__") || !strcmp(rec->name, "__setstate__");

#if !defined(NDEBUG) && !defined(PYBIND11_DISABLE_NEW_STYLE_INIT_WARNING)
        if (rec->is_constructor && !rec->is_new_style_constructor) {
            const auto class_name = detail::get_fully_qualified_tp_name((PyTypeObject *) rec->scope.ptr());
            const auto func_name = std::string(rec->name);
            PyErr_WarnEx(
                PyExc_FutureWarning,
                ("pybind11-bound class '" + class_name + "' is using an old-style "
                 "placement-new '" + func_name + "' which has been deprecated. See "
                 "the upgrade guide in pybind11's docs. This message is only visible "
                 "when compiled in debug mode.").c_str(), 0
            );
        }
#endif

        /* Generate a proper function signature */
        std::string signature;
        size_t type_index = 0, arg_index = 0;
        for (auto *pc = text; *pc != '\0'; ++pc) {
            const auto c = *pc;

            if (c == '{') {
                // Write arg name for everything except *args and **kwargs.
                if (*(pc + 1) == '*')
                    continue;
                // Separator for keyword-only arguments, placed before the kw
                // arguments start
                if (rec->nargs_kw_only > 0 && arg_index + rec->nargs_kw_only == args)
                    signature += "*, ";
                if (arg_index < rec->args.size() && rec->args[arg_index].name) {
                    signature += rec->args[arg_index].name;
                } else if (arg_index == 0 && rec->is_method) {
                    signature += "self";
                } else {
                    signature += "arg" + std::to_string(arg_index - (rec->is_method ? 1 : 0));
                }
                signature += ": ";
            } else if (c == '}') {
                // Write default value if available.
                if (arg_index < rec->args.size() && rec->args[arg_index].descr) {
                    signature += " = ";
                    signature += rec->args[arg_index].descr;
                }
                // Separator for positional-only arguments (placed after the
                // argument, rather than before like *
                if (rec->nargs_pos_only > 0 && (arg_index + 1) == rec->nargs_pos_only)
                    signature += ", /";
                arg_index++;
            } else if (c == '%') {
                const std::type_info *t = types[type_index++];
                if (!t)
                    pybind11_fail("Internal error while parsing type signature (1)");
                if (auto tinfo = detail::get_type_info(*t)) {
                    handle th((PyObject *) tinfo->type);
                    signature +=
                        th.attr("__module__").cast<std::string>() + "." +
                        th.attr("__qualname__").cast<std::string>(); // Python 3.3+, but we backport it to earlier versions
                } else if (rec->is_new_style_constructor && arg_index == 0) {
                    // A new-style `__init__` takes `self` as `value_and_holder`.
                    // Rewrite it to the proper class type.
                    signature +=
                        rec->scope.attr("__module__").cast<std::string>() + "." +
                        rec->scope.attr("__qualname__").cast<std::string>();
                } else {
                    std::string tname(t->name());
                    detail::clean_type_id(tname);
                    signature += tname;
                }
            } else {
                signature += c;
            }
        }

        if (arg_index != args || types[type_index] != nullptr)
            pybind11_fail("Internal error while parsing type signature (2)");

#if PY_MAJOR_VERSION < 3
        if (strcmp(rec->name, "__next__") == 0) {
            std::free(rec->name);
            rec->name = guarded_strdup("next");
        } else if (strcmp(rec->name, "__bool__") == 0) {
            std::free(rec->name);
            rec->name = guarded_strdup("__nonzero__");
        }
#endif
        rec->signature = guarded_strdup(signature.c_str());
        rec->args.shrink_to_fit();
        rec->nargs = (std::uint16_t) args;

        if (rec->sibling && PYBIND11_INSTANCE_METHOD_CHECK(rec->sibling.ptr()))
            rec->sibling = PYBIND11_INSTANCE_METHOD_GET_FUNCTION(rec->sibling.ptr());

        detail::function_record *chain = nullptr, *chain_start = rec;
        if (rec->sibling) {
            if (PyCFunction_Check(rec->sibling.ptr())) {
                auto rec_capsule = reinterpret_borrow<capsule>(PyCFunction_GET_SELF(rec->sibling.ptr()));
                chain = (detail::function_record *) rec_capsule;
                /* Never append a method to an overload chain of a parent class;
                   instead, hide the parent's overloads in this case */
                if (!chain->scope.is(rec->scope))
                    chain = nullptr;
            }
            // Don't trigger for things like the default __init__, which are wrapper_descriptors that we are intentionally replacing
            else if (!rec->sibling.is_none() && rec->name[0] != '_')
                pybind11_fail("Cannot overload existing non-function object \"" + std::string(rec->name) +
                        "\" with a function of the same name");
        }

        if (!chain) {
            /* No existing overload was found, create a new function object */
            rec->def = new PyMethodDef();
            std::memset(rec->def, 0, sizeof(PyMethodDef));
            rec->def->ml_name = rec->name;
            rec->def->ml_meth = reinterpret_cast<PyCFunction>(reinterpret_cast<void (*) (void)>(*dispatcher));
            rec->def->ml_flags = METH_VARARGS | METH_KEYWORDS;

            capsule rec_capsule(unique_rec.release(), [](void *ptr) {
                destruct((detail::function_record *) ptr);
            });
            guarded_strdup.release();

            object scope_module;
            if (rec->scope) {
                if (hasattr(rec->scope, "__module__")) {
                    scope_module = rec->scope.attr("__module__");
                } else if (hasattr(rec->scope, "__name__")) {
                    scope_module = rec->scope.attr("__name__");
                }
            }

            m_ptr = PyCFunction_NewEx(rec->def, rec_capsule.ptr(), scope_module.ptr());
            if (!m_ptr)
                pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
        } else {
            /* Append at the beginning or end of the overload chain */
            m_ptr = rec->sibling.ptr();
            inc_ref();
            if (chain->is_method != rec->is_method)
                pybind11_fail("overloading a method with both static and instance methods is not supported; "
                    #if defined(NDEBUG)
                        "compile in debug mode for more details"
                    #else
                        "error while attempting to bind " + std::string(rec->is_method ? "instance" : "static") + " method " +
                        std::string(pybind11::str(rec->scope.attr("__name__"))) + "." + std::string(rec->name) + signature
                    #endif
                );

            if (rec->prepend) {
                // Beginning of chain; we need to replace the capsule's current head-of-the-chain
                // pointer with this one, then make this one point to the previous head of the
                // chain.
                chain_start = rec;
                rec->next = chain;
                auto rec_capsule = reinterpret_borrow<capsule>(((PyCFunctionObject *) m_ptr)->m_self);
                rec_capsule.set_pointer(unique_rec.release());
                guarded_strdup.release();
            } else {
                // Or end of chain (normal behavior)
                chain_start = chain;
                while (chain->next)
                    chain = chain->next;
                chain->next = unique_rec.release();
                guarded_strdup.release();
            }
        }

        std::string signatures;
        int index = 0;
        /* Create a nice pydoc rec including all signatures and
           docstrings of the functions in the overload chain */
        if (chain && options::show_function_signatures()) {
            // First a generic signature
            signatures += rec->name;
            signatures += "(*args, **kwargs)\n";
            signatures += "Overloaded function.\n\n";
        }
        // Then specific overload signatures
        bool first_user_def = true;
        for (auto it = chain_start; it != nullptr; it = it->next) {
            if (options::show_function_signatures()) {
                if (index > 0) signatures += "\n";
                if (chain)
                    signatures += std::to_string(++index) + ". ";
                signatures += rec->name;
                signatures += it->signature;
                signatures += "\n";
            }
            if (it->doc && strlen(it->doc) > 0 && options::show_user_defined_docstrings()) {
                // If we're appending another docstring, and aren't printing function signatures, we
                // need to append a newline first:
                if (!options::show_function_signatures()) {
                    if (first_user_def) first_user_def = false;
                    else signatures += "\n";
                }
                if (options::show_function_signatures()) signatures += "\n";
                signatures += it->doc;
                if (options::show_function_signatures()) signatures += "\n";
            }
        }

        /* Install docstring */
        auto *func = (PyCFunctionObject *) m_ptr;
        std::free(const_cast<char *>(func->m_ml->ml_doc));
        // Install docstring if it's non-empty (when at least one option is enabled)
        func->m_ml->ml_doc = signatures.empty() ? nullptr : strdup(signatures.c_str());

        if (rec->is_method) {
            m_ptr = PYBIND11_INSTANCE_METHOD_NEW(m_ptr, rec->scope.ptr());
            if (!m_ptr)
                pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
            Py_DECREF(func);
        }
    }